

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[63],unsigned_int&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [63],uint *params_1,
          char (*params_2) [2])

{
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  CappedArray<char,_14UL> local_40;
  
  local_50 = toCharSequence<char_const(&)[63]>((char (*) [63])this);
  toCharSequence<unsigned_int&>(&local_40,(kj *)params,(uint *)local_50.size_);
  local_60 = toCharSequence<char_const(&)[2]>((char (*) [2])params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_50,(ArrayPtr<const_char> *)&local_40,
             (CappedArray<char,_14UL> *)&local_60,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}